

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O2

bool __thiscall cmFindBase::CheckForVariableDefined(cmFindBase *this)

{
  string *name;
  bool bVar1;
  bool bVar2;
  CacheEntryType CVar3;
  cmValue cVar4;
  cmState *this_00;
  cmValue l;
  char *extraout_RDX;
  CacheEntryType CVar5;
  string_view value;
  allocator<char> local_51;
  string local_50;
  
  name = &this->VariableName;
  cVar4 = cmMakefile::GetDefinition((this->super_cmFindCommon).Makefile,name);
  if (cVar4.Value != (string *)0x0) {
    this_00 = cmMakefile::GetState((this->super_cmFindCommon).Makefile);
    l = cmState::GetCacheEntryValue(this_00,name);
    value._M_str = extraout_RDX;
    value._M_len = (size_t)((cVar4.Value)->_M_dataplus)._M_p;
    bVar1 = cmValue::IsNOTFOUND((cmValue *)(cVar4.Value)->_M_string_length,value);
    bVar2 = ::operator!=(l,(nullptr_t)0x0);
    CVar5 = UNINITIALIZED;
    if ((bVar2) && (CVar3 = cmState::GetCacheEntryType(this_00,name), CVar3 != UNINITIALIZED)) {
      this->VariableType = CVar3;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"HELPSTRING",&local_51)
      ;
      cVar4 = cmState::GetCacheEntryProperty(this_00,name,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      CVar5 = CVar3;
      if (cVar4.Value != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)&this->VariableDocumentation);
      }
    }
    if (!bVar1) {
      if (!bVar2 || CVar5 != UNINITIALIZED) {
        return true;
      }
      this->AlreadyInCacheWithoutMetaInfo = true;
      return true;
    }
  }
  return false;
}

Assistant:

bool cmFindBase::CheckForVariableDefined()
{
  if (cmValue value = this->Makefile->GetDefinition(this->VariableName)) {
    cmState* state = this->Makefile->GetState();
    cmValue cacheEntry = state->GetCacheEntryValue(this->VariableName);
    bool found = !cmIsNOTFOUND(*value);
    bool cached = cacheEntry != nullptr;
    auto cacheType = cached ? state->GetCacheEntryType(this->VariableName)
                            : cmStateEnums::UNINITIALIZED;

    if (cached && cacheType != cmStateEnums::UNINITIALIZED) {
      this->VariableType = cacheType;
      if (const auto& hs =
            state->GetCacheEntryProperty(this->VariableName, "HELPSTRING")) {
        this->VariableDocumentation = *hs;
      }
    }

    if (found) {
      // If the user specifies the entry on the command line without a
      // type we should add the type and docstring but keep the
      // original value.  Tell the subclass implementations to do
      // this.
      if (cached && cacheType == cmStateEnums::UNINITIALIZED) {
        this->AlreadyInCacheWithoutMetaInfo = true;
      }
      return true;
    }
  }
  return false;
}